

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
InlinedVector<std::__cxx11::string_const*>
          (InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last,
          polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *alloc)

{
  long lVar1;
  pointer pcVar2;
  InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
  *pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *iter;
  
  *(memory_resource **)this = alloc->memoryResource;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this,(long)last - (long)first >> 5);
  if (last != first) {
    do {
      lVar1 = *(long *)(this + 0x98);
      pIVar3 = *(InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
                 **)(this + 8);
      if (*(InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
            **)(this + 8) ==
          (InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
           *)0x0) {
        pIVar3 = this + 0x10;
      }
      *(InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
        **)(pIVar3 + lVar1 * 0x20 + 0x10 + -0x10) = pIVar3 + lVar1 * 0x20 + 0x10;
      pcVar2 = (first->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pIVar3 + lVar1 * 0x20),pcVar2,pcVar2 + first->_M_string_length);
      first = first + 1;
      *(long *)(this + 0x98) = *(long *)(this + 0x98) + 1;
    } while (first != last);
  }
  return;
}

Assistant:

InlinedVector(InputIt first, InputIt last, const Allocator &alloc = {})
        : alloc(alloc) {
        reserve(last - first);
        for (InputIt iter = first; iter != last; ++iter, ++nStored)
            this->alloc.template construct<T>(begin() + nStored, *iter);
    }